

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_utils.c
# Opt level: O2

cupdlp_retcode
dense_alloc_matrix(CUPDLPdense *dense,cupdlp_int nRows,cupdlp_int nCols,void *src,
                  CUPDLP_MATRIX_FORMAT src_matrix_format)

{
  cupdlp_float *pcVar1;
  cupdlp_retcode cVar2;
  
  pcVar1 = (cupdlp_float *)calloc((long)(nRows * nCols),8);
  dense->data = pcVar1;
  if (pcVar1 == (cupdlp_float *)0x0) {
    cVar2 = 1;
  }
  else {
    cVar2 = 0;
    if (src_matrix_format == CSC) {
      csc2dense(dense,(CUPDLPcsc *)src);
    }
    else if (src_matrix_format == CSR) {
      csr2dense(dense,(CUPDLPcsr *)src);
    }
    else {
      cVar2 = 0;
      if (src_matrix_format == DENSE) {
        dense_copy(dense,(CUPDLPdense *)src);
      }
    }
  }
  return cVar2;
}

Assistant:

cupdlp_retcode dense_alloc_matrix(CUPDLPdense *dense, cupdlp_int nRows,
                                  cupdlp_int nCols, void *src,
                                  CUPDLP_MATRIX_FORMAT src_matrix_format) {
  cupdlp_retcode retcode = RETCODE_OK;
  cupdlp_init_zero_vec_double(dense->data, nRows * nCols);

  switch (src_matrix_format) {
    case DENSE:
      dense_copy(dense, (CUPDLPdense *)src);
      break;
    case CSR:
      csr2dense(dense, (CUPDLPcsr *)src);
      break;
    case CSC:
      csc2dense(dense, (CUPDLPcsc *)src);
      break;
    default:
      break;
  }
exit_cleanup:
  return retcode;
}